

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O3

bool cmValue::IsOff(string_view value)

{
  bool bVar1;
  int iVar2;
  char *in_RDX;
  byte bVar3;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> bStack_10;
  
  value_00._M_len = (byte *)value._M_str;
  bStack_10._M_len = value._M_len;
  switch(bStack_10._M_len) {
  case 0:
    bVar3 = 1;
    goto LAB_00125387;
  case 1:
    if ((byte)(*value_00._M_len - 0x30) < 0x3f) {
      bVar3 = (byte)(0x4000000040000001 >> (*value_00._M_len - 0x30 & 0x3f));
      goto LAB_00125387;
    }
    break;
  case 2:
    if ((*value_00._M_len | 0x20) == 0x6e) {
      bVar3 = (value_00._M_len[1] & 0xdf) == 0x4f;
      goto LAB_00125387;
    }
    break;
  case 3:
    if (((*value_00._M_len | 0x20) == 0x6f) && ((value_00._M_len[1] | 0x20) == 0x66)) {
      bVar3 = (value_00._M_len[2] & 0xdf) == 0x46;
      goto LAB_00125387;
    }
    break;
  case 4:
    value_00._M_str = in_RDX;
    bVar1 = IsNOTFOUND((cmValue *)bStack_10._M_len,value_00);
    return bVar1;
  case 5:
    if ((((*value_00._M_len | 0x20) == 0x66) && ((value_00._M_len[1] | 0x20) == 0x61)) &&
       (((value_00._M_len[2] | 0x20) == 0x6c && ((value_00._M_len[3] | 0x20) == 0x73)))) {
      bVar3 = value_00._M_len[4];
LAB_0012537c:
      bVar3 = (bVar3 & 0xdf) == 0x45;
      goto LAB_00125387;
    }
    break;
  case 6:
    if (((((*value_00._M_len | 0x20) == 0x69) && ((value_00._M_len[1] | 0x20) == 0x67)) &&
        ((value_00._M_len[2] | 0x20) == 0x6e)) &&
       (((value_00._M_len[3] | 0x20) == 0x6f && ((value_00._M_len[4] | 0x20) == 0x72)))) {
      bVar3 = value_00._M_len[5];
      goto LAB_0012537c;
    }
    break;
  default:
    if ((cmValue *)bStack_10._M_len == (cmValue *)0x8) {
      if (*(long *)value_00._M_len == 0x444e554f46544f4e) {
        return true;
      }
    }
    else if ((cmValue *)0x8 < bStack_10._M_len) {
      __str._M_str = "-NOTFOUND";
      __str._M_len = 9;
      bStack_10._M_str = (char *)value_00._M_len;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&bStack_10,
                         (size_type)((long)&((cmValue *)(bStack_10._M_len + -0x10))->Value + 7),9,
                         __str);
      return iVar2 == 0;
    }
    return false;
  }
  bVar3 = 0;
LAB_00125387:
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmValue::IsOff(cm::string_view value) noexcept
{
  switch (value.size()) {
    case 0:
      return true;
    case 1:
      return value[0] == '0' || value[0] == 'N' || value[0] == 'n';
    case 2:
      return                                    //
        (value[0] == 'N' || value[0] == 'n') && //
        (value[1] == 'O' || value[1] == 'o');
    case 3:
      return                                    //
        (value[0] == 'O' || value[0] == 'o') && //
        (value[1] == 'F' || value[1] == 'f') && //
        (value[2] == 'F' || value[2] == 'f');
    case 5:
      return                                    //
        (value[0] == 'F' || value[0] == 'f') && //
        (value[1] == 'A' || value[1] == 'a') && //
        (value[2] == 'L' || value[2] == 'l') && //
        (value[3] == 'S' || value[3] == 's') && //
        (value[4] == 'E' || value[4] == 'e');
    case 6:
      return                                    //
        (value[0] == 'I' || value[0] == 'i') && //
        (value[1] == 'G' || value[1] == 'g') && //
        (value[2] == 'N' || value[2] == 'n') && //
        (value[3] == 'O' || value[3] == 'o') && //
        (value[4] == 'R' || value[4] == 'r') && //
        (value[5] == 'E' || value[5] == 'e');
    default:
      break;
  }

  return IsNOTFOUND(value);
}